

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_1>::updateTransitionMatrices
          (EigenDecompositionCube<double,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,double **transitionMatrices,int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  double *pdVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  
  uVar8 = (this->super_EigenDecomposition<double,_1>).kStateCount;
  uVar18 = (ulong)uVar8;
  uVar24 = uVar8 + 3;
  if (-1 < (int)uVar8) {
    uVar24 = uVar8;
  }
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar26 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
      uVar28 = 0;
      uVar18 = (ulong)uVar8;
      do {
        if (0 < (int)uVar26) {
          iVar21 = 0;
          pdVar10 = transitionMatrices[probabilityIndices[uVar28]];
          lVar20 = 0;
          do {
            if (0 < (int)uVar18) {
              lVar29 = 0;
              do {
                dVar30 = exp(edgeLengths[uVar28] * categoryRates[lVar20] *
                             (this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex]
                             [lVar29]);
                (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar29] = dVar30;
                lVar29 = lVar29 + 1;
                iVar9 = (this->super_EigenDecomposition<double,_1>).kStateCount;
                uVar18 = (ulong)iVar9;
              } while (lVar29 < (long)uVar18);
              if (0 < iVar9) {
                iVar22 = 0;
                pdVar19 = this->gCMatrices[eigenIndex];
                do {
                  pdVar11 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                  iVar23 = 0;
                  lVar29 = (long)iVar21;
                  do {
                    lVar25 = lVar29;
                    if ((int)uVar8 < 4) {
                      auVar33 = ZEXT1664(ZEXT816(0));
                      uVar26 = 0;
                    }
                    else {
                      auVar33 = ZEXT1664(ZEXT816(0));
                      uVar26 = 0;
                      do {
                        auVar34._8_8_ = 0;
                        auVar34._0_8_ = pdVar19[uVar26];
                        auVar38._8_8_ = 0;
                        auVar38._0_8_ = pdVar19[uVar26 + 1];
                        auVar36._8_8_ = 0;
                        auVar36._0_8_ = pdVar11[uVar26];
                        auVar36 = vfmadd132sd_fma(auVar34,auVar33._0_16_,auVar36);
                        auVar32._8_8_ = 0;
                        auVar32._0_8_ = pdVar19[uVar26 + 3];
                        auVar1._8_8_ = 0;
                        auVar1._0_8_ = pdVar11[uVar26 + 1];
                        auVar36 = vfmadd231sd_fma(auVar36,auVar38,auVar1);
                        auVar39._8_8_ = 0;
                        auVar39._0_8_ = pdVar19[uVar26 + 2];
                        auVar2._8_8_ = 0;
                        auVar2._0_8_ = pdVar11[uVar26 + 2];
                        auVar36 = vfmadd132sd_fma(auVar39,auVar36,auVar2);
                        auVar3._8_8_ = 0;
                        auVar3._0_8_ = pdVar11[uVar26 + 3];
                        auVar36 = vfmadd132sd_fma(auVar32,auVar36,auVar3);
                        auVar33 = ZEXT1664(auVar36);
                        uVar26 = uVar26 + 4;
                      } while ((long)uVar26 < (long)(int)(uVar24 & 0xfffffffc));
                    }
                    auVar36 = auVar33._0_16_;
                    if ((int)uVar26 < iVar9) {
                      uVar26 = uVar26 & 0xffffffff;
                      do {
                        auVar35._8_8_ = 0;
                        auVar35._0_8_ = pdVar19[uVar26];
                        auVar4._8_8_ = 0;
                        auVar4._0_8_ = pdVar11[uVar26];
                        auVar36 = vfmadd231sd_fma(auVar33._0_16_,auVar35,auVar4);
                        auVar33 = ZEXT1664(auVar36);
                        uVar26 = uVar26 + 1;
                      } while (uVar18 != uVar26);
                    }
                    auVar36 = vmaxsd_avx(auVar36,ZEXT816(0) << 0x40);
                    pdVar19 = pdVar19 + uVar18;
                    iVar23 = iVar23 + 1;
                    pdVar10[lVar25] = auVar36._0_8_;
                    lVar29 = lVar25 + 1;
                  } while (iVar23 != iVar9);
                  iVar21 = (int)lVar25 + 2;
                  iVar22 = iVar22 + 1;
                  pdVar10[(int)(lVar25 + 1)] = 1.0;
                } while (iVar22 != iVar9);
              }
            }
            uVar26 = (ulong)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
            lVar20 = lVar20 + 1;
          } while (lVar20 < (long)uVar26);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != (uint)count);
    }
  }
  else if (secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar26 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
      uVar28 = 0;
      do {
        if (0 < (int)uVar26) {
          iVar21 = 0;
          pdVar10 = transitionMatrices[probabilityIndices[uVar28]];
          pdVar19 = transitionMatrices[firstDerivativeIndices[uVar28]];
          lVar20 = 0;
          do {
            if (0 < (int)uVar18) {
              lVar29 = 0;
              do {
                dVar30 = (this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex]
                         [lVar29] * categoryRates[lVar20];
                dVar31 = exp(dVar30 * edgeLengths[uVar28]);
                (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar29] = dVar31;
                (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar29] = dVar31 * dVar30;
                lVar29 = lVar29 + 1;
                iVar9 = (this->super_EigenDecomposition<double,_1>).kStateCount;
                uVar18 = (ulong)iVar9;
              } while (lVar29 < (long)uVar18);
              if (0 < iVar9) {
                iVar22 = 0;
                lVar29 = 0;
                do {
                  pdVar11 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                  pdVar12 = (this->super_EigenDecomposition<double,_1>).firstDerivTmp;
                  iVar23 = iVar9 + iVar21;
                  pdVar13 = this->gCMatrices[eigenIndex];
                  lVar25 = (long)iVar21;
                  do {
                    lVar27 = lVar25;
                    auVar33 = ZEXT864(0) << 0x40;
                    auVar36 = ZEXT816(0) << 0x40;
                    uVar26 = 0;
                    do {
                      auVar40._8_8_ = 0;
                      auVar40._0_8_ = pdVar13[(long)(int)lVar29 + uVar26];
                      auVar16._8_8_ = 0;
                      auVar16._0_8_ = pdVar11[uVar26];
                      auVar36 = vfmadd231sd_fma(auVar36,auVar40,auVar16);
                      auVar17._8_8_ = 0;
                      auVar17._0_8_ = pdVar12[uVar26];
                      auVar16 = vfmadd231sd_fma(auVar33._0_16_,auVar40,auVar17);
                      auVar33 = ZEXT1664(auVar16);
                      uVar26 = uVar26 + 1;
                    } while (uVar18 != uVar26);
                    auVar36 = vmaxsd_avx(auVar36,ZEXT816(0) << 0x40);
                    lVar29 = (long)(int)lVar29 + uVar18;
                    pdVar10[lVar27] = auVar36._0_8_;
                    pdVar19[lVar27] = auVar16._0_8_;
                    lVar25 = lVar27 + 1;
                  } while (iVar23 != (int)(lVar27 + 1));
                  iVar21 = (int)lVar27 + 2;
                  iVar22 = iVar22 + 1;
                  pdVar10[iVar23] = 1.0;
                  pdVar19[iVar23] = 0.0;
                } while (iVar22 != iVar9);
              }
            }
            uVar26 = (ulong)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
            lVar20 = lVar20 + 1;
          } while (lVar20 < (long)uVar26);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != (uint)count);
    }
  }
  else if (0 < count) {
    uVar26 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
    uVar28 = 0;
    do {
      if (0 < (int)uVar26) {
        iVar21 = 0;
        pdVar10 = transitionMatrices[probabilityIndices[uVar28]];
        pdVar19 = transitionMatrices[firstDerivativeIndices[uVar28]];
        pdVar11 = transitionMatrices[secondDerivativeIndices[uVar28]];
        lVar20 = 0;
        do {
          if (0 < (int)uVar18) {
            lVar29 = 0;
            do {
              dVar30 = (this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex][lVar29]
                       * categoryRates[lVar20];
              dVar31 = exp(dVar30 * edgeLengths[uVar28]);
              (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar29] = dVar31;
              (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar29] = dVar30 * dVar31;
              (this->super_EigenDecomposition<double,_1>).secondDerivTmp[lVar29] =
                   dVar30 * dVar30 * dVar31;
              lVar29 = lVar29 + 1;
              iVar9 = (this->super_EigenDecomposition<double,_1>).kStateCount;
              uVar18 = (ulong)iVar9;
            } while (lVar29 < (long)uVar18);
            if (0 < iVar9) {
              iVar22 = 0;
              lVar29 = 0;
              do {
                pdVar12 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                pdVar13 = (this->super_EigenDecomposition<double,_1>).firstDerivTmp;
                pdVar14 = (this->super_EigenDecomposition<double,_1>).secondDerivTmp;
                iVar23 = iVar9 + iVar21;
                pdVar15 = this->gCMatrices[eigenIndex];
                lVar25 = (long)iVar21;
                do {
                  lVar27 = lVar25;
                  auVar33 = ZEXT864(0) << 0x40;
                  auVar37 = ZEXT864(0) << 0x40;
                  auVar36 = ZEXT816(0) << 0x40;
                  uVar26 = 0;
                  do {
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = pdVar15[(long)(int)lVar29 + uVar26];
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = pdVar12[uVar26];
                    auVar36 = vfmadd231sd_fma(auVar36,auVar41,auVar5);
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = pdVar13[uVar26];
                    auVar16 = vfmadd231sd_fma(auVar37._0_16_,auVar41,auVar6);
                    auVar37 = ZEXT1664(auVar16);
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = pdVar14[uVar26];
                    auVar17 = vfmadd231sd_fma(auVar33._0_16_,auVar41,auVar7);
                    auVar33 = ZEXT1664(auVar17);
                    uVar26 = uVar26 + 1;
                  } while (uVar18 != uVar26);
                  auVar36 = vmaxsd_avx(auVar36,ZEXT816(0) << 0x40);
                  lVar29 = (long)(int)lVar29 + uVar18;
                  pdVar10[lVar27] = auVar36._0_8_;
                  pdVar19[lVar27] = auVar16._0_8_;
                  pdVar11[lVar27] = auVar17._0_8_;
                  lVar25 = lVar27 + 1;
                } while (iVar23 != (int)(lVar27 + 1));
                iVar21 = (int)lVar27 + 2;
                iVar22 = iVar22 + 1;
                pdVar10[iVar23] = 1.0;
                pdVar19[iVar23] = 0.0;
                pdVar11[iVar23] = 0.0;
              } while (iVar22 != iVar9);
            }
          }
          uVar26 = (ulong)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
          lVar20 = lVar20 + 1;
        } while (lVar20 < (long)uVar26);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      const double* categoryRates,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
//	if (probabilityIndices == NULL) {  // used to store derivative matrices for derivatives through pre-order traversals
//
//	    if (secondDerivativeIndices == NULL) {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        firstDerivTmp[i] = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    } else {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                        firstDerivTmp[i] = scaledEigenValue;
//                        secondDerivTmp[i] = scaledEigenValue * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            REALTYPE sumD2 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            secondDerivMat[n] = sumD2;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            secondDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    }
//
//	} else {

        if (firstDerivativeIndices == NULL &&secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        matrixTmp[i] = exp(gEigenValues[eigenIndex][i] * ((REALTYPE)edgeLengths[u] * categoryRates[l]));
                    }

                    REALTYPE* tmpCMatrices = gCMatrices[eigenIndex];
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
#ifdef UNROLL
                            int k = 0;
                            for (; k < stateCountModFour; k += 4) {
                                sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
                                sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
                                sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
                                sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
                            }
                            for (; k < kStateCount; k++) {
                                sum += tmpCMatrices[k] * matrixTmp[k];
                            }
                            tmpCMatrices += kStateCount;
#else
                            for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            n += T_PAD;
                        }
                    }
                }

                if (DEBUGGING_OUTPUT) {
                    int kMatrixSize = kStateCount * kStateCount;
                    fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
                    for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                        fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
                }
            }


        } else if (secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k]; ///gCMatrices[eigenIndex] =  eigenVectors \otimes InveigenVectors
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        } else {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                        secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            REALTYPE sumD2 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k];
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            secondDerivMat[n] = sumD2;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            secondDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        }
//    }
}